

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O2

void __thiscall LazySegtree_LotsOfQueries_Test::TestBody(LazySegtree_LotsOfQueries_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int to;
  int iVar4;
  bool bVar5;
  undefined1 local_80 [8];
  Segtree tree;
  Naive naive;
  
  local_80 = (undefined1  [8])0xde0b6b3a7640000;
  tree.INF = 0x6400000000;
  tree.l = 0;
  tree.r = 0;
  tree.val = 0;
  tree.lazy = 0;
  tree.lson = (Segtree *)0x0;
  Naive::Naive((Naive *)&tree.rson,100);
  compare((Segtree *)local_80,(Naive *)&tree.rson);
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    iVar4 = 10;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      iVar1 = rand();
      iVar1 = iVar1 % 99;
      iVar2 = rand();
      to = iVar1 + iVar2 % (99 - iVar1) + 1;
      iVar2 = rand();
      Segtree::rangeUpdate((Segtree *)local_80,iVar1,to,(long)(iVar2 % 100));
      Naive::rangeUpdate((Naive *)&tree.rson,iVar1,to,(long)(iVar2 % 100));
    }
    compare((Segtree *)local_80,(Naive *)&tree.rson);
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&tree.rson);
  Segtree::~Segtree((Segtree *)local_80);
  return;
}

Assistant:

TEST(LazySegtree, LotsOfQueries) {
    int n = 100;
    Segtree tree(0,n);
    Naive naive(n);
    compare(tree, naive);
    
    rep(it1,0,100) {
        rep(it2,0,10) {
            int fr = rand() % (n-1);
            int to = rand() % (n-1-fr) + 1 + fr;
            int val = rand() % 100;

            tree.rangeUpdate(fr, to, val);
            naive.rangeUpdate(fr, to, val);
        }
        compare(tree, naive);
    }
}